

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_xxspltw(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t i;
  uint32_t uVar2;
  int iVar3;
  int bofs;
  int tofs;
  int uim;
  int rb;
  int rt;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = xT(ctx->opcode);
  i = xB(ctx->opcode);
  uVar2 = UIM(ctx->opcode);
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    uVar1 = vsr_full_offset(uVar1);
    iVar3 = vsr_full_offset(i);
    tcg_gen_gvec_dup_mem_ppc64(tcg_ctx_00,2,uVar1,uVar2 * 4 + iVar3 ^ 0xc,0x10,0x10);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_xxspltw(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rt = xT(ctx->opcode);
    int rb = xB(ctx->opcode);
    int uim = UIM(ctx->opcode);
    int tofs, bofs;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }

    tofs = vsr_full_offset(rt);
    bofs = vsr_full_offset(rb);
    bofs += uim << MO_32;
#ifndef HOST_WORDS_BIGENDIAN
    bofs ^= 8 | 4;
#endif

    tcg_gen_gvec_dup_mem(tcg_ctx, MO_32, tofs, bofs, 16, 16);
}